

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_handle.cpp
# Opt level: O3

WallTimer __thiscall
miniros::NodeHandle::createWallTimer
          (NodeHandle *this,WallDuration *period,WallTimerCallback *callback,bool oneshot,
          bool autostart)

{
  undefined7 in_register_00000009;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  WallTimer WVar2;
  WallTimerOptions ops;
  DurationBase<miniros::WallDuration> local_78;
  _Any_data local_70;
  code *local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined1 uStack_48;
  undefined7 uStack_47;
  undefined1 local_40;
  undefined7 uStack_3f;
  undefined1 local_38;
  undefined1 local_37;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  
  local_78.sec = 0;
  local_78.nsec = 0;
  DurationBase<miniros::WallDuration>::fromSec(&local_78,0.1);
  local_70._M_unused._M_object = (void *)0x0;
  local_70._8_8_ = 0;
  local_60 = (code *)0x0;
  uStack_58 = 0;
  local_50 = 0;
  uStack_48 = 0;
  uStack_47 = 0;
  local_40 = 0;
  uStack_3f = 0;
  local_38 = 0;
  local_37 = 1;
  local_78 = *(DurationBase<miniros::WallDuration> *)&(callback->super__Function_base)._M_functor;
  std::function<void_(const_miniros::WallTimerEvent_&)>::operator=
            ((function<void_(const_miniros::WallTimerEvent_&)> *)&local_70,
             (function<void_(const_miniros::WallTimerEvent_&)> *)
             CONCAT71(in_register_00000009,oneshot));
  local_38 = autostart;
  WVar2 = createWallTimer(this,(WallTimerOptions *)period);
  _Var1._M_pi = WVar2.impl_.super___shared_ptr<miniros::WallTimer::Impl,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT71(uStack_3f,local_40) !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT71(uStack_3f,local_40));
    _Var1._M_pi = extraout_RDX;
  }
  if (local_60 != (code *)0x0) {
    (*local_60)(&local_70,&local_70,__destroy_functor);
    _Var1._M_pi = extraout_RDX_00;
  }
  WVar2.impl_.super___shared_ptr<miniros::WallTimer::Impl,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var1._M_pi;
  WVar2.impl_.super___shared_ptr<miniros::WallTimer::Impl,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (WallTimer)
         WVar2.impl_.super___shared_ptr<miniros::WallTimer::Impl,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

WallTimer NodeHandle::createWallTimer(WallDuration period, const WallTimerCallback& callback, 
                                      bool oneshot, bool autostart) const
{
  WallTimerOptions ops;
  ops.period = period;
  ops.callback = callback;
  ops.oneshot = oneshot;
  ops.autostart = autostart;
  return createWallTimer(ops);
}